

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O0

UChar * u_strFromUTF8WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,char *src,int32_t srcLength
                  ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  byte bVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  UChar *pUVar5;
  uint8_t __t2_4;
  uint8_t __t1_4;
  uint8_t __t2_3;
  uint8_t __t1_3;
  uint8_t __t2_2;
  uint8_t __t1_2;
  int32_t count2;
  int32_t count;
  UChar32 c_1;
  int32_t i_1;
  uint8_t __t2_1;
  uint8_t __t1_1;
  uint8_t __t2;
  uint8_t __t1;
  UChar32 c;
  int32_t i;
  int32_t numSubstitutions;
  int32_t reqLength;
  UChar *pDestLimit;
  UChar *pDest;
  UChar32 subchar_local;
  int32_t srcLength_local;
  char *src_local;
  int32_t *pDestLength_local;
  UChar *pUStack_18;
  int32_t destCapacity_local;
  UChar *dest_local;
  
  pDest._0_4_ = subchar;
  pDest._4_4_ = srcLength;
  _subchar_local = (uint8_t *)src;
  src_local = (char *)pDestLength;
  pDestLength_local._4_4_ = destCapacity;
  pUStack_18 = dest;
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 == '\0') {
    if ((((_subchar_local == (uint8_t *)0x0) && (pDest._4_4_ != 0)) || (pDest._4_4_ < -1)) ||
       ((((pDestLength_local._4_4_ < 0 ||
          ((pUStack_18 == (UChar *)0x0 && (0 < pDestLength_local._4_4_)))) ||
         (0x10ffff < (int)(uint)pDest)) || (((uint)pDest & 0xfffff800) == 0xd800)))) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      dest_local = (UChar *)0x0;
    }
    else {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      pDestLimit = pUStack_18;
      _numSubstitutions = pUStack_18 + pDestLength_local._4_4_;
      i = 0;
      c = 0;
      if (pDest._4_4_ < 0) {
        ___t2_1 = 0;
        while( true ) {
          bVar1 = _subchar_local[___t2_1];
          i_1 = (int32_t)bVar1;
          if (i_1 == 0 || _numSubstitutions <= pDestLimit) break;
          iVar3 = ___t2_1 + 1;
          if ((bVar1 & 0x80) == 0) {
            *pDestLimit = (ushort)bVar1;
            ___t2_1 = iVar3;
            pDestLimit = pDestLimit + 1;
          }
          else if ((((uint)i_1 < 0xe0) || (0xef < (uint)i_1)) ||
                  ((((int)" 000000000000\x1000"[(int)(i_1 & 0xf)] &
                    1 << (sbyte)((int)(uint)_subchar_local[iVar3] >> 5)) == 0 ||
                   (c_1._2_1_ = _subchar_local[___t2_1 + 2] + 0x80, 0x3f < c_1._2_1_)))) {
            if ((((uint)i_1 < 0xe0) && (0xc1 < (uint)i_1)) &&
               (c_1._3_1_ = _subchar_local[iVar3] + 0x80, c_1._3_1_ < 0x40)) {
              *pDestLimit = (ushort)((i_1 & 0x1fU) << 6) | (ushort)c_1._3_1_;
              ___t2_1 = ___t2_1 + 2;
              pDestLimit = pDestLimit + 1;
            }
            else {
              ___t2_1 = iVar3;
              i_1 = utf8_nextCharSafeBody_63(_subchar_local,(int32_t *)&__t2_1,-1,i_1,-1);
              if (i_1 < 0) {
                c = c + 1;
                i_1 = (uint)pDest;
                if ((int)(uint)pDest < 0) {
                  *pErrorCode = U_INVALID_CHAR_FOUND;
                  return (UChar *)0x0;
                }
              }
              if (i_1 < 0x10000) {
                *pDestLimit = (UChar)i_1;
                pDestLimit = pDestLimit + 1;
              }
              else {
                pUVar5 = pDestLimit + 1;
                *pDestLimit = (short)(i_1 >> 10) + L'ퟀ';
                if (_numSubstitutions <= pUVar5) {
                  i = i + 1;
                  pDestLimit = pUVar5;
                  break;
                }
                pDestLimit = pDestLimit + 2;
                *pUVar5 = (UChar)i_1 & 0x3ffU | 0xdc00;
              }
            }
          }
          else {
            *pDestLimit = (ushort)((i_1 & 0xfU) << 0xc) |
                          ((short)(char)_subchar_local[iVar3] & 0x3fU) << 6 | (ushort)c_1._2_1_;
            ___t2_1 = ___t2_1 + 3;
            pDestLimit = pDestLimit + 1;
          }
        }
        while( true ) {
          i_1 = (int32_t)_subchar_local[___t2_1];
          if (i_1 == 0) break;
          iVar3 = ___t2_1 + 1;
          if ((_subchar_local[___t2_1] & 0x80) == 0) {
            i = i + 1;
            ___t2_1 = iVar3;
          }
          else if (((((uint)i_1 < 0xe0) || (0xef < (uint)i_1)) ||
                   (((int)" 000000000000\x1000"[(int)(i_1 & 0xf)] &
                    1 << (sbyte)((int)(uint)_subchar_local[iVar3] >> 5)) == 0)) ||
                  (c_1._0_1_ = _subchar_local[___t2_1 + 2] + 0x80, 0x3f < (byte)c_1)) {
            if ((((uint)i_1 < 0xe0) && (0xc1 < (uint)i_1)) &&
               (c_1._1_1_ = _subchar_local[iVar3] + 0x80, c_1._1_1_ < 0x40)) {
              i = i + 1;
              ___t2_1 = ___t2_1 + 2;
            }
            else {
              ___t2_1 = iVar3;
              i_1 = utf8_nextCharSafeBody_63(_subchar_local,(int32_t *)&__t2_1,-1,i_1,-1);
              if (i_1 < 0) {
                c = c + 1;
                i_1 = (uint)pDest;
                if ((int)(uint)pDest < 0) {
                  *pErrorCode = U_INVALID_CHAR_FOUND;
                  return (UChar *)0x0;
                }
              }
              iVar3 = 2;
              if ((uint)i_1 < 0x10000) {
                iVar3 = 1;
              }
              i = iVar3 + i;
            }
          }
          else {
            i = i + 1;
            ___t2_1 = ___t2_1 + 3;
          }
        }
        i_1 = 0;
      }
      else {
        count = 0;
LAB_003a9401:
        ___t2_3 = (int)((long)_numSubstitutions - (long)pDestLimit >> 1);
        iVar3 = (pDest._4_4_ - count) / 3;
        if (iVar3 < ___t2_3) {
          ___t2_3 = iVar3;
        }
        if (2 < ___t2_3) {
          do {
            iVar3 = count + 1;
            bVar1 = _subchar_local[count];
            uVar4 = (uint)bVar1;
            if ((bVar1 & 0x80) == 0) {
              *pDestLimit = (ushort)bVar1;
              count = iVar3;
              pDestLimit = pDestLimit + 1;
            }
            else if (((uVar4 < 0xe0) || (0xef < uVar4)) ||
                    ((pDest._4_4_ <= count + 2 ||
                     ((((int)" 000000000000\x1000"[(int)(uVar4 & 0xf)] &
                       1 << (sbyte)((int)(uint)_subchar_local[iVar3] >> 5)) == 0 ||
                      (0x3f < (byte)(_subchar_local[count + 2] + 0x80))))))) {
              if ((uVar4 < 0xe0) &&
                 (((0xc1 < uVar4 && (iVar3 != pDest._4_4_)) &&
                  ((byte)(_subchar_local[iVar3] + 0x80) < 0x40)))) {
                *pDestLimit = (ushort)((uVar4 & 0x1f) << 6) |
                              (ushort)(byte)(_subchar_local[iVar3] + 0x80);
                count = count + 2;
                pDestLimit = pDestLimit + 1;
              }
              else {
                if (((0xef < uVar4) || (0xffff < (int)(uint)pDest)) &&
                   (___t2_3 = ___t2_3 + -1, ___t2_3 == 0)) break;
                count = iVar3;
                count2 = utf8_nextCharSafeBody_63(_subchar_local,&count,pDest._4_4_,uVar4,-1);
                if (count2 < 0) {
                  c = c + 1;
                  count2 = (uint)pDest;
                  if ((int)(uint)pDest < 0) {
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return (UChar *)0x0;
                  }
                }
                if (count2 < 0x10000) {
                  *pDestLimit = (UChar)count2;
                  pDestLimit = pDestLimit + 1;
                }
                else {
                  pUVar5 = pDestLimit + 1;
                  *pDestLimit = (short)(count2 >> 10) + L'ퟀ';
                  pDestLimit = pDestLimit + 2;
                  *pUVar5 = (UChar)count2 & 0x3ffU | 0xdc00;
                }
              }
            }
            else {
              *pDestLimit = (ushort)((uVar4 & 0xf) << 0xc) |
                            ((short)(char)_subchar_local[iVar3] & 0x3fU) << 6 |
                            (ushort)(byte)(_subchar_local[count + 2] + 0x80);
              count = count + 3;
              pDestLimit = pDestLimit + 1;
            }
            ___t2_3 = ___t2_3 + -1;
          } while (0 < ___t2_3);
          goto LAB_003a9401;
        }
        while (count < pDest._4_4_ && pDestLimit < _numSubstitutions) {
          iVar3 = count + 1;
          bVar1 = _subchar_local[count];
          uVar4 = (uint)bVar1;
          if ((bVar1 & 0x80) == 0) {
            *pDestLimit = (ushort)bVar1;
            count = iVar3;
            pDestLimit = pDestLimit + 1;
          }
          else if (((uVar4 < 0xe0) || (0xef < uVar4)) ||
                  ((pDest._4_4_ <= count + 2 ||
                   ((((int)" 000000000000\x1000"[(int)(uVar4 & 0xf)] &
                     1 << (sbyte)((int)(uint)_subchar_local[iVar3] >> 5)) == 0 ||
                    (0x3f < (byte)(_subchar_local[count + 2] + 0x80))))))) {
            if ((uVar4 < 0xe0) &&
               (((0xc1 < uVar4 && (iVar3 != pDest._4_4_)) &&
                ((byte)(_subchar_local[iVar3] + 0x80) < 0x40)))) {
              *pDestLimit = (ushort)((uVar4 & 0x1f) << 6) |
                            (ushort)(byte)(_subchar_local[iVar3] + 0x80);
              count = count + 2;
              pDestLimit = pDestLimit + 1;
            }
            else {
              count = iVar3;
              count2 = utf8_nextCharSafeBody_63(_subchar_local,&count,pDest._4_4_,uVar4,-1);
              if (count2 < 0) {
                c = c + 1;
                count2 = (uint)pDest;
                if ((int)(uint)pDest < 0) {
                  *pErrorCode = U_INVALID_CHAR_FOUND;
                  return (UChar *)0x0;
                }
              }
              if (count2 < 0x10000) {
                *pDestLimit = (UChar)count2;
                pDestLimit = pDestLimit + 1;
              }
              else {
                pUVar5 = pDestLimit + 1;
                *pDestLimit = (short)(count2 >> 10) + L'ퟀ';
                if (_numSubstitutions <= pUVar5) {
                  i = i + 1;
                  pDestLimit = pUVar5;
                  break;
                }
                pDestLimit = pDestLimit + 2;
                *pUVar5 = (UChar)count2 & 0x3ffU | 0xdc00;
              }
            }
          }
          else {
            *pDestLimit = (ushort)((uVar4 & 0xf) << 0xc) |
                          ((short)(char)_subchar_local[iVar3] & 0x3fU) << 6 |
                          (ushort)(byte)(_subchar_local[count + 2] + 0x80);
            count = count + 3;
            pDestLimit = pDestLimit + 1;
          }
        }
        while (count < pDest._4_4_) {
          iVar3 = count + 1;
          uVar4 = (uint)_subchar_local[count];
          if ((_subchar_local[count] & 0x80) == 0) {
            i = i + 1;
            count = iVar3;
          }
          else if (((uVar4 < 0xe0) || (0xef < uVar4)) ||
                  ((pDest._4_4_ <= count + 2 ||
                   ((((int)" 000000000000\x1000"[(int)(uVar4 & 0xf)] &
                     1 << (sbyte)((int)(uint)_subchar_local[iVar3] >> 5)) == 0 ||
                    (0x3f < (byte)(_subchar_local[count + 2] + 0x80))))))) {
            if ((uVar4 < 0xe0) &&
               (((0xc1 < uVar4 && (iVar3 != pDest._4_4_)) &&
                ((byte)(_subchar_local[iVar3] + 0x80) < 0x40)))) {
              i = i + 1;
              count = count + 2;
            }
            else {
              count = iVar3;
              count2 = utf8_nextCharSafeBody_63(_subchar_local,&count,pDest._4_4_,uVar4,-1);
              if (count2 < 0) {
                c = c + 1;
                count2 = (uint)pDest;
                if ((int)(uint)pDest < 0) {
                  *pErrorCode = U_INVALID_CHAR_FOUND;
                  return (UChar *)0x0;
                }
              }
              iVar3 = 2;
              if ((uint)count2 < 0x10000) {
                iVar3 = 1;
              }
              i = iVar3 + i;
            }
          }
          else {
            i = i + 1;
            count = count + 3;
          }
        }
      }
      i = (int)((long)pDestLimit - (long)pUStack_18 >> 1) + i;
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = c;
      }
      if (src_local != (char *)0x0) {
        *(int32_t *)src_local = i;
      }
      u_terminateUChars_63(pUStack_18,pDestLength_local._4_4_,i,pErrorCode);
      dest_local = pUStack_18;
    }
  }
  else {
    dest_local = (UChar *)0x0;
  }
  return dest_local;
}

Assistant:

U_CAPI UChar* U_EXPORT2
u_strFromUTF8WithSub(UChar *dest,
              int32_t destCapacity,
              int32_t *pDestLength,
              const char* src,
              int32_t srcLength,
              UChar32 subchar, int32_t *pNumSubstitutions,
              UErrorCode *pErrorCode){
    /* args check */
    if(U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    UChar *pDest = dest;
    UChar *pDestLimit = dest+destCapacity;
    int32_t reqLength = 0;
    int32_t numSubstitutions=0;

    /*
     * Inline processing of UTF-8 byte sequences:
     *
     * Byte sequences for the most common characters are handled inline in
     * the conversion loops. In order to reduce the path lengths for those
     * characters, the tests are arranged in a kind of binary search.
     * ASCII (<=0x7f) is checked first, followed by the dividing point
     * between 2- and 3-byte sequences (0xe0).
     * The 3-byte branch is tested first to speed up CJK text.
     * The compiler should combine the subtractions for the two tests for 0xe0.
     * Each branch then tests for the other end of its range.
     */

    if(srcLength < 0){
        /*
         * Transform a NUL-terminated string.
         * The code explicitly checks for NULs only in the lead byte position.
         * A NUL byte in the trail byte position fails the trail byte range check anyway.
         */
        int32_t i;
        UChar32 c;
        for(i = 0; (c = (uint8_t)src[i]) != 0 && (pDest < pDestLimit);) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while((c = (uint8_t)src[i]) != 0) {
            // modified copy of U8_NEXT()
            ++i;
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), -1, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    } else /* srcLength >= 0 */ {
        /* Faster loop without ongoing checking for srcLength and pDestLimit. */
        int32_t i = 0;
        UChar32 c;
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            int32_t count = (int32_t)(pDestLimit - pDest);
            int32_t count2 = (srcLength - i) / 3;
            if(count > count2) {
                count = count2; /* min(remaining dest, remaining src/3) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }

            do {
                // modified copy of U8_NEXT()
                c = (uint8_t)src[i++];
                if(U8_IS_SINGLE(c)) {
                    *pDest++=(UChar)c;
                } else {
                    uint8_t __t1, __t2;
                    if( /* handle U+0800..U+FFFF inline */
                            (0xe0<=(c) && (c)<0xf0) &&
                            ((i)+1)<srcLength &&
                            U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                            (__t2=src[(i)+1]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                        i+=2;
                    } else if( /* handle U+0080..U+07FF inline */
                            ((c)<0xe0 && (c)>=0xc2) &&
                            ((i)!=srcLength) &&
                            (__t1=src[i]-0x80)<=0x3f) {
                        *pDest++ = (((c)&0x1f)<<6)|__t1;
                        ++(i);
                    } else {
                        if(c >= 0xf0 || subchar > 0xffff) {
                            // We may read up to four bytes and write up to two UChars,
                            // which we didn't account for with computing count,
                            // so we adjust it here.
                            if(--count == 0) {
                                --i;  // back out byte c
                                break;
                            }
                        }

                        /* function call for "complicated" and error cases */
                        (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                        if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        } else if(c<=0xFFFF) {
                            *(pDest++)=(UChar)c;
                        } else {
                            *(pDest++)=U16_LEAD(c);
                            *(pDest++)=U16_TRAIL(c);
                        }
                    }
                }
            } while(--count > 0);
        }

        while(i < srcLength && (pDest < pDestLimit)) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                *pDest++=(UChar)c;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0xf)<<12)|((src[i]&0x3f)<<6)|__t2;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    *pDest++ = (((c)&0x1f)<<6)|__t1;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    } else if(c<=0xFFFF) {
                        *(pDest++)=(UChar)c;
                    } else {
                        *(pDest++)=U16_LEAD(c);
                        if(pDest<pDestLimit) {
                            *(pDest++)=U16_TRAIL(c);
                        } else {
                            reqLength++;
                            break;
                        }
                    }
                }
            }
        }

        /* Pre-flight the rest of the string. */
        while(i < srcLength) {
            // modified copy of U8_NEXT()
            c = (uint8_t)src[i++];
            if(U8_IS_SINGLE(c)) {
                ++reqLength;
            } else {
                uint8_t __t1, __t2;
                if( /* handle U+0800..U+FFFF inline */
                        (0xe0<=(c) && (c)<0xf0) &&
                        ((i)+1)<srcLength &&
                        U8_IS_VALID_LEAD3_AND_T1((c), src[i]) &&
                        (__t2=src[(i)+1]-0x80)<=0x3f) {
                    ++reqLength;
                    i+=2;
                } else if( /* handle U+0080..U+07FF inline */
                        ((c)<0xe0 && (c)>=0xc2) &&
                        ((i)!=srcLength) &&
                        (__t1=src[i]-0x80)<=0x3f) {
                    ++reqLength;
                    ++(i);
                } else {
                    /* function call for "complicated" and error cases */
                    (c)=utf8_nextCharSafeBody((const uint8_t *)src, &(i), srcLength, c, -1);
                    if(c<0 && (++numSubstitutions, c = subchar) < 0) {
                        *pErrorCode = U_INVALID_CHAR_FOUND;
                        return NULL;
                    }
                    reqLength += U16_LENGTH(c);
                }
            }
        }
    }

    reqLength+=(int32_t)(pDest - dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest,destCapacity,reqLength,pErrorCode);

    return dest;
}